

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall
Executor::assertValueType(Executor *this,Value *value,TypeName *type,string *activity,Node *node)

{
  mapped_type *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (value->valueType_ == *type) {
    return;
  }
  std::operator+(&local_38,"Cannot perform ",activity);
  std::operator+(&bStack_98,&local_38," with value of type ");
  __rhs = std::__detail::
          _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&TypeNameStrings_abi_cxx11_,&value->valueType_);
  std::operator+(&local_78,&bStack_98,__rhs);
  std::operator+(&local_58,&local_78,"!");
  reportError(&local_58,node);
}

Assistant:

void Executor::assertValueType(const Value& value, const TypeName& type, const std::string& activity, const Node& node) const
{
  if(value.getType() != type)
    reportError("Cannot perform " + activity +
      " with value of type " + TypeNameStrings.at(value.getType()) + "!", node);
}